

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  bool bVar28;
  uint uVar29;
  undefined4 uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar35;
  size_t sVar36;
  size_t sVar37;
  uint uVar38;
  NodeRef *pNVar39;
  NodeRef root;
  size_t i_1;
  long lVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [64];
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar163;
  undefined1 auVar159 [16];
  float fVar161;
  float fVar162;
  undefined1 auVar160 [64];
  float fVar164;
  float fVar169;
  float fVar170;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  Precalculations pre;
  float local_38d8;
  float fStack_38d4;
  float fStack_38d0;
  RTCFilterFunctionNArguments args;
  undefined1 local_3888 [8];
  float fStack_3880;
  undefined4 uStack_387c;
  undefined1 local_3878 [16];
  RayK<4> *local_3860;
  vbool<4> terminated;
  undefined1 local_3838 [16];
  undefined1 local_3828 [16];
  undefined1 local_3818 [16];
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3738;
  undefined1 local_3708 [16];
  undefined1 local_36f8 [16];
  undefined1 local_36e8 [16];
  undefined1 local_36d8 [16];
  uint local_36c8;
  uint uStack_36c4;
  uint uStack_36c0;
  uint uStack_36bc;
  uint uStack_36b8;
  uint uStack_36b4;
  uint uStack_36b0;
  uint uStack_36ac;
  undefined1 local_36a8 [16];
  undefined8 local_3698;
  undefined8 uStack_3690;
  TravRayK<4,_true> tray;
  Vec3vf<4> Ng;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar27 = mm_lookupmask_ps._248_8_;
  uVar26 = mm_lookupmask_ps._240_8_;
  uVar25 = mm_lookupmask_ps._8_8_;
  uVar24 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar109 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar98 = vpcmpeqd_avx(auVar109,(undefined1  [16])valid_i->field_0);
    auVar85 = ZEXT816(0) << 0x40;
    auVar11 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar85,5);
    auVar95 = auVar98 & auVar11;
    if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar95[0xf] < '\0')
    {
      auVar11 = vandps_avx(auVar11,auVar98);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      local_36a8._8_4_ = 0x7fffffff;
      local_36a8._0_8_ = 0x7fffffff7fffffff;
      local_36a8._12_4_ = 0x7fffffff;
      auVar98 = vandps_avx(local_36a8,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar141._8_4_ = 0x219392ef;
      auVar141._0_8_ = 0x219392ef219392ef;
      auVar141._12_4_ = 0x219392ef;
      auVar95 = vcmpps_avx(auVar98,auVar141,1);
      auVar150._8_4_ = 0x3f800000;
      auVar150._0_8_ = 0x3f8000003f800000;
      auVar150._12_4_ = 0x3f800000;
      auVar121 = vdivps_avx(auVar150,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar98 = vandps_avx(local_36a8,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar86 = vcmpps_avx(auVar98,auVar141,1);
      auVar122 = vdivps_avx(auVar150,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar98 = vandps_avx(local_36a8,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar98 = vcmpps_avx(auVar98,auVar141,1);
      auVar123 = vdivps_avx(auVar150,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar142._8_4_ = 0x5d5e0b6b;
      auVar142._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar142._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar121,auVar142,auVar95)
      ;
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar122,auVar142,auVar86)
      ;
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar123,auVar142,auVar98)
      ;
      auVar98 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar85,1);
      auVar121._8_4_ = 0x20;
      auVar121._0_8_ = 0x2000000020;
      auVar121._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar98,auVar121);
      auVar98 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar85,5);
      auVar95._8_4_ = 0x40;
      auVar95._0_8_ = 0x4000000040;
      auVar95._12_4_ = 0x40;
      auVar122._8_4_ = 0x60;
      auVar122._0_8_ = 0x6000000060;
      auVar122._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar122,auVar95,auVar98)
      ;
      auVar98 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar85,5);
      auVar86._8_4_ = 0x80;
      auVar86._0_8_ = 0x8000000080;
      auVar86._12_4_ = 0x80;
      auVar123._8_4_ = 0xa0;
      auVar123._0_8_ = 0xa0000000a0;
      auVar123._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar123,auVar86,auVar98)
      ;
      auVar98 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar85);
      auVar95 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar85);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar155 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar98,auVar11);
      auVar77 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar98._8_4_ = 0xff800000;
      auVar98._0_8_ = 0xff800000ff800000;
      auVar98._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar98,auVar95,auVar11);
      terminated.field_0.i[1] = auVar11._4_4_ ^ auVar109._4_4_;
      terminated.field_0.i[0] = auVar11._0_4_ ^ auVar109._0_4_;
      terminated.field_0.i[2] = auVar11._8_4_ ^ auVar109._8_4_;
      terminated.field_0.i[3] = auVar11._12_4_ ^ auVar109._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar38 = 3;
      }
      else {
        uVar38 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_3860 = ray + 0x80;
      pNVar39 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar35 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_0163d894:
      do {
        do {
          root.ptr = pNVar39[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0163edfb;
          pNVar39 = pNVar39 + -1;
          paVar35 = paVar35 + -1;
          aVar165 = *paVar35;
          auVar109 = vcmpps_avx((undefined1  [16])aVar165,(undefined1  [16])tray.tfar.field_0,1);
          uVar29 = vmovmskps_avx(auVar109);
        } while (uVar29 == 0);
        uVar41 = (ulong)(byte)uVar29;
        if (uVar38 < (uint)POPCOUNT(uVar29 & 0xff)) {
LAB_0163d8d4:
          iVar31 = 4;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0163edfb;
              auVar109 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar165,6)
              ;
              if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar109 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar109 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar109[0xf]) goto LAB_0163d894;
              auVar109 = vpcmpeqd_avx(auVar109,auVar109);
              lVar34 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              lVar33 = 0;
              local_3838 = auVar109 ^ (undefined1  [16])terminated.field_0;
              goto LAB_0163dacf;
            }
            sVar37 = 8;
            aVar165 = auVar155._0_16_;
            for (lVar34 = 0;
                (lVar34 != 8 &&
                (sVar3 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar34 * 8), sVar3 != 8));
                lVar34 = lVar34 + 1) {
              uVar30 = *(undefined4 *)(root.ptr + 0x40 + lVar34 * 4);
              auVar42._4_4_ = uVar30;
              auVar42._0_4_ = uVar30;
              auVar42._8_4_ = uVar30;
              auVar42._12_4_ = uVar30;
              auVar17._8_8_ = tray.org.field_0._8_8_;
              auVar17._0_8_ = tray.org.field_0._0_8_;
              auVar18._8_8_ = tray.org.field_0._24_8_;
              auVar18._0_8_ = tray.org.field_0._16_8_;
              auVar19._8_8_ = tray.org.field_0._40_8_;
              auVar19._0_8_ = tray.org.field_0._32_8_;
              auVar109 = vsubps_avx(auVar42,auVar17);
              auVar119._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar109._0_4_;
              auVar119._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar109._4_4_;
              auVar119._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar109._8_4_;
              auVar119._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar109._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x80 + lVar34 * 4);
              auVar43._4_4_ = uVar30;
              auVar43._0_4_ = uVar30;
              auVar43._8_4_ = uVar30;
              auVar43._12_4_ = uVar30;
              auVar109 = vsubps_avx(auVar43,auVar18);
              auVar129._0_4_ = tray.rdir.field_0._16_4_ * auVar109._0_4_;
              auVar129._4_4_ = tray.rdir.field_0._20_4_ * auVar109._4_4_;
              auVar129._8_4_ = tray.rdir.field_0._24_4_ * auVar109._8_4_;
              auVar129._12_4_ = tray.rdir.field_0._28_4_ * auVar109._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0xc0 + lVar34 * 4);
              auVar44._4_4_ = uVar30;
              auVar44._0_4_ = uVar30;
              auVar44._8_4_ = uVar30;
              auVar44._12_4_ = uVar30;
              auVar109 = vsubps_avx(auVar44,auVar19);
              auVar143._0_4_ = tray.rdir.field_0._32_4_ * auVar109._0_4_;
              auVar143._4_4_ = tray.rdir.field_0._36_4_ * auVar109._4_4_;
              auVar143._8_4_ = tray.rdir.field_0._40_4_ * auVar109._8_4_;
              auVar143._12_4_ = tray.rdir.field_0._44_4_ * auVar109._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x60 + lVar34 * 4);
              auVar45._4_4_ = uVar30;
              auVar45._0_4_ = uVar30;
              auVar45._8_4_ = uVar30;
              auVar45._12_4_ = uVar30;
              auVar109 = vsubps_avx(auVar45,auVar17);
              auVar67._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar109._0_4_;
              auVar67._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar109._4_4_;
              auVar67._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar109._8_4_;
              auVar67._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar109._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0xa0 + lVar34 * 4);
              auVar46._4_4_ = uVar30;
              auVar46._0_4_ = uVar30;
              auVar46._8_4_ = uVar30;
              auVar46._12_4_ = uVar30;
              auVar109 = vsubps_avx(auVar46,auVar18);
              auVar78._0_4_ = tray.rdir.field_0._16_4_ * auVar109._0_4_;
              auVar78._4_4_ = tray.rdir.field_0._20_4_ * auVar109._4_4_;
              auVar78._8_4_ = tray.rdir.field_0._24_4_ * auVar109._8_4_;
              auVar78._12_4_ = tray.rdir.field_0._28_4_ * auVar109._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0xe0 + lVar34 * 4);
              auVar47._4_4_ = uVar30;
              auVar47._0_4_ = uVar30;
              auVar47._8_4_ = uVar30;
              auVar47._12_4_ = uVar30;
              auVar109 = vsubps_avx(auVar47,auVar19);
              auVar99._0_4_ = tray.rdir.field_0._32_4_ * auVar109._0_4_;
              auVar99._4_4_ = tray.rdir.field_0._36_4_ * auVar109._4_4_;
              auVar99._8_4_ = tray.rdir.field_0._40_4_ * auVar109._8_4_;
              auVar99._12_4_ = tray.rdir.field_0._44_4_ * auVar109._12_4_;
              auVar109 = vminps_avx(auVar119,auVar67);
              auVar98 = vminps_avx(auVar129,auVar78);
              auVar109 = vmaxps_avx(auVar109,auVar98);
              auVar98 = vminps_avx(auVar143,auVar99);
              auVar109 = vmaxps_avx(auVar109,auVar98);
              auVar48._0_4_ = auVar149._0_4_ * auVar109._0_4_;
              auVar48._4_4_ = auVar149._4_4_ * auVar109._4_4_;
              auVar48._8_4_ = auVar149._8_4_ * auVar109._8_4_;
              auVar48._12_4_ = auVar149._12_4_ * auVar109._12_4_;
              auVar109 = vmaxps_avx(auVar119,auVar67);
              auVar98 = vmaxps_avx(auVar129,auVar78);
              auVar98 = vminps_avx(auVar109,auVar98);
              auVar109 = vmaxps_avx(auVar143,auVar99);
              auVar109 = vminps_avx(auVar98,auVar109);
              auVar68._0_4_ = auVar160._0_4_ * auVar109._0_4_;
              auVar68._4_4_ = auVar160._4_4_ * auVar109._4_4_;
              auVar68._8_4_ = auVar160._8_4_ * auVar109._8_4_;
              auVar68._12_4_ = auVar160._12_4_ * auVar109._12_4_;
              auVar109 = vmaxps_avx(auVar48,(undefined1  [16])tray.tnear.field_0);
              auVar98 = vminps_avx(auVar68,(undefined1  [16])tray.tfar.field_0);
              auVar109 = vcmpps_avx(auVar109,auVar98,2);
              auVar77 = ZEXT1664(auVar109);
              sVar36 = sVar37;
              aVar10 = aVar165;
              if (((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar109[0xf] < '\0') &&
                 (aVar10.v = (__m128)vblendvps_avx(auVar155._0_16_,auVar48,auVar109), sVar36 = sVar3
                 , sVar37 != 8)) {
                pNVar39->ptr = sVar37;
                pNVar39 = pNVar39 + 1;
                *paVar35 = aVar165;
                paVar35 = paVar35 + 1;
              }
              aVar165 = aVar10;
              sVar37 = sVar36;
            }
            if (sVar37 == 8) goto LAB_0163da66;
            auVar109 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar165,6);
            uVar30 = vmovmskps_avx(auVar109);
            root.ptr = sVar37;
          } while ((byte)uVar38 < (byte)POPCOUNT(uVar30));
          pNVar39->ptr = sVar37;
          pNVar39 = pNVar39 + 1;
          *paVar35 = aVar165;
          paVar35 = paVar35 + 1;
        }
        else {
          while (uVar41 != 0) {
            sVar37 = 0;
            for (uVar16 = uVar41; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              sVar37 = sVar37 + 1;
            }
            uVar41 = uVar41 - 1 & uVar41;
            auVar77 = ZEXT1664(auVar77._0_16_);
            bVar28 = occluded1(This,bvh,root,sVar37,&pre,ray,&tray,context);
            if (bVar28) {
              terminated.field_0.i[sVar37] = -1;
            }
          }
          auVar109 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar31 = 3;
          auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar109[0xf] < '\0') {
            auVar77 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar109._8_4_ = 0xff800000;
            auVar109._0_8_ = 0xff800000ff800000;
            auVar109._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar109,
                               (undefined1  [16])terminated.field_0);
            iVar31 = 2;
          }
          if (uVar38 < (uint)POPCOUNT(uVar29 & 0xff)) goto LAB_0163d8d4;
        }
LAB_0163da66:
      } while (iVar31 != 3);
LAB_0163edfb:
      auVar11 = vandps_avx(auVar11,(undefined1  [16])terminated.field_0);
      auVar76._8_4_ = 0xff800000;
      auVar76._0_8_ = 0xff800000ff800000;
      auVar76._12_4_ = 0xff800000;
      auVar11 = vmaskmovps_avx(auVar11,auVar76);
      *(undefined1 (*) [16])local_3860 = auVar11;
    }
  }
  return;
LAB_0163dacf:
  do {
    auVar109 = auVar77._0_16_;
    if (lVar33 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    lVar32 = lVar33 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    auVar77 = ZEXT1664(local_3838);
    lVar40 = 0;
    do {
      auVar98 = auVar77._0_16_;
      if (lVar40 == 4) break;
      uVar29 = *(uint *)(lVar34 + lVar40 * 4);
      if ((ulong)uVar29 == 0xffffffff) break;
      uVar30 = *(undefined4 *)(lVar34 + -0xc0 + lVar40 * 4);
      auVar49._4_4_ = uVar30;
      auVar49._0_4_ = uVar30;
      auVar49._8_4_ = uVar30;
      auVar49._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar34 + -0xb0 + lVar40 * 4);
      auVar79._4_4_ = uVar30;
      auVar79._0_4_ = uVar30;
      auVar79._8_4_ = uVar30;
      auVar79._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar34 + -0xa0 + lVar40 * 4);
      auVar157._4_4_ = uVar30;
      auVar157._0_4_ = uVar30;
      auVar157._8_4_ = uVar30;
      auVar157._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar34 + -0x90 + lVar40 * 4);
      auVar120._4_4_ = uVar30;
      auVar120._0_4_ = uVar30;
      auVar120._8_4_ = uVar30;
      auVar120._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar34 + -0x80 + lVar40 * 4);
      auVar124._4_4_ = uVar30;
      auVar124._0_4_ = uVar30;
      auVar124._8_4_ = uVar30;
      auVar124._12_4_ = uVar30;
      local_3888._4_4_ = *(undefined4 *)(lVar34 + -0x70 + lVar40 * 4);
      local_3888._0_4_ = local_3888._4_4_;
      fStack_3880 = (float)local_3888._4_4_;
      uStack_387c = local_3888._4_4_;
      local_3818._4_4_ = *(undefined4 *)(lVar34 + -0x60 + lVar40 * 4);
      local_3818._0_4_ = local_3818._4_4_;
      local_3818._8_4_ = local_3818._4_4_;
      local_3818._12_4_ = local_3818._4_4_;
      local_3828._4_4_ = *(undefined4 *)(lVar34 + -0x50 + lVar40 * 4);
      local_3828._0_4_ = local_3828._4_4_;
      local_3828._8_4_ = local_3828._4_4_;
      local_3828._12_4_ = local_3828._4_4_;
      uVar30 = *(undefined4 *)(lVar34 + -0x40 + lVar40 * 4);
      uVar1 = *(undefined4 *)(lVar34 + -0x30 + lVar40 * 4);
      auVar166._4_4_ = uVar1;
      auVar166._0_4_ = uVar1;
      auVar166._8_4_ = uVar1;
      auVar166._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar34 + -0x20 + lVar40 * 4);
      auVar144._4_4_ = uVar1;
      auVar144._0_4_ = uVar1;
      auVar144._8_4_ = uVar1;
      auVar144._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar34 + -0x10 + lVar40 * 4);
      auVar151._4_4_ = uVar1;
      auVar151._0_4_ = uVar1;
      auVar151._8_4_ = uVar1;
      auVar151._12_4_ = uVar1;
      local_3698 = *(undefined8 *)(lVar32 + 0xd0);
      uStack_3690 = *(undefined8 *)(lVar32 + 0xd8);
      auVar109 = *(undefined1 (*) [16])ray;
      auVar95 = *(undefined1 (*) [16])(ray + 0x10);
      auVar85 = *(undefined1 (*) [16])(ray + 0x20);
      auVar122 = vsubps_avx(auVar49,auVar109);
      auVar123 = vsubps_avx(auVar79,auVar95);
      auVar141 = vsubps_avx(auVar157,auVar85);
      auVar142 = vsubps_avx(auVar144,auVar95);
      auVar150 = vsubps_avx(auVar151,auVar85);
      auVar49 = vsubps_avx(auVar142,auVar123);
      auVar79 = vsubps_avx(auVar150,auVar141);
      auVar145._0_4_ = auVar142._0_4_ + auVar123._0_4_;
      auVar145._4_4_ = auVar142._4_4_ + auVar123._4_4_;
      auVar145._8_4_ = auVar142._8_4_ + auVar123._8_4_;
      auVar145._12_4_ = auVar142._12_4_ + auVar123._12_4_;
      fVar6 = auVar141._0_4_;
      auVar152._0_4_ = auVar150._0_4_ + fVar6;
      fVar7 = auVar141._4_4_;
      auVar152._4_4_ = auVar150._4_4_ + fVar7;
      fVar8 = auVar141._8_4_;
      auVar152._8_4_ = auVar150._8_4_ + fVar8;
      fVar9 = auVar141._12_4_;
      auVar152._12_4_ = auVar150._12_4_ + fVar9;
      auVar158._0_4_ = auVar145._0_4_ * auVar79._0_4_;
      auVar158._4_4_ = auVar145._4_4_ * auVar79._4_4_;
      auVar158._8_4_ = auVar145._8_4_ * auVar79._8_4_;
      auVar158._12_4_ = auVar145._12_4_ * auVar79._12_4_;
      auVar147 = vfmsub231ps_fma(auVar158,auVar49,auVar152);
      auVar157 = vsubps_avx(auVar166,auVar109);
      auVar158 = vsubps_avx(auVar157,auVar122);
      auVar153._0_4_ = auVar152._0_4_ * auVar158._0_4_;
      auVar153._4_4_ = auVar152._4_4_ * auVar158._4_4_;
      auVar153._8_4_ = auVar152._8_4_ * auVar158._8_4_;
      auVar153._12_4_ = auVar152._12_4_ * auVar158._12_4_;
      auVar167._0_4_ = auVar157._0_4_ + auVar122._0_4_;
      auVar167._4_4_ = auVar157._4_4_ + auVar122._4_4_;
      auVar167._8_4_ = auVar157._8_4_ + auVar122._8_4_;
      auVar167._12_4_ = auVar157._12_4_ + auVar122._12_4_;
      auVar121 = vfmsub231ps_fma(auVar153,auVar79,auVar167);
      auVar168._0_4_ = auVar167._0_4_ * auVar49._0_4_;
      auVar168._4_4_ = auVar167._4_4_ * auVar49._4_4_;
      auVar168._8_4_ = auVar167._8_4_ * auVar49._8_4_;
      auVar168._12_4_ = auVar167._12_4_ * auVar49._12_4_;
      auVar86 = vfmsub231ps_fma(auVar168,auVar158,auVar145);
      fVar12 = *(float *)(ray + 0x60);
      fVar13 = *(float *)(ray + 100);
      fVar14 = *(float *)(ray + 0x68);
      auVar23 = *(undefined1 (*) [12])(ray + 0x60);
      fVar15 = *(float *)(ray + 0x6c);
      auVar135._0_4_ = auVar86._0_4_ * fVar12;
      auVar135._4_4_ = auVar86._4_4_ * fVar13;
      auVar135._8_4_ = auVar86._8_4_ * fVar14;
      auVar135._12_4_ = auVar86._12_4_ * fVar15;
      auVar86 = *(undefined1 (*) [16])(ray + 0x50);
      auVar135 = vfmadd231ps_fma(auVar135,auVar86,auVar121);
      auVar121 = *(undefined1 (*) [16])(ray + 0x40);
      auVar145 = vfmadd231ps_fma(auVar135,auVar121,auVar147);
      auVar109 = vsubps_avx(auVar120,auVar109);
      auVar95 = vsubps_avx(auVar124,auVar95);
      auVar85 = vsubps_avx(_local_3888,auVar85);
      auVar135 = vsubps_avx(auVar123,auVar95);
      auVar141 = vsubps_avx(auVar141,auVar85);
      auVar112._0_4_ = auVar123._0_4_ + auVar95._0_4_;
      auVar112._4_4_ = auVar123._4_4_ + auVar95._4_4_;
      auVar112._8_4_ = auVar123._8_4_ + auVar95._8_4_;
      auVar112._12_4_ = auVar123._12_4_ + auVar95._12_4_;
      auVar130._0_4_ = fVar6 + auVar85._0_4_;
      auVar130._4_4_ = fVar7 + auVar85._4_4_;
      auVar130._8_4_ = fVar8 + auVar85._8_4_;
      auVar130._12_4_ = fVar9 + auVar85._12_4_;
      fVar172 = auVar141._0_4_;
      auVar147._0_4_ = fVar172 * auVar112._0_4_;
      fVar173 = auVar141._4_4_;
      auVar147._4_4_ = fVar173 * auVar112._4_4_;
      fVar174 = auVar141._8_4_;
      auVar147._8_4_ = fVar174 * auVar112._8_4_;
      fVar175 = auVar141._12_4_;
      auVar147._12_4_ = fVar175 * auVar112._12_4_;
      auVar152 = vfmsub231ps_fma(auVar147,auVar135,auVar130);
      auVar147 = vsubps_avx(auVar122,auVar109);
      fVar164 = auVar147._0_4_;
      auVar131._0_4_ = fVar164 * auVar130._0_4_;
      fVar169 = auVar147._4_4_;
      auVar131._4_4_ = fVar169 * auVar130._4_4_;
      fVar170 = auVar147._8_4_;
      auVar131._8_4_ = fVar170 * auVar130._8_4_;
      fVar171 = auVar147._12_4_;
      auVar131._12_4_ = fVar171 * auVar130._12_4_;
      auVar125._0_4_ = auVar122._0_4_ + auVar109._0_4_;
      auVar125._4_4_ = auVar122._4_4_ + auVar109._4_4_;
      auVar125._8_4_ = auVar122._8_4_ + auVar109._8_4_;
      auVar125._12_4_ = auVar122._12_4_ + auVar109._12_4_;
      auVar130 = vfmsub231ps_fma(auVar131,auVar141,auVar125);
      fVar156 = auVar135._0_4_;
      auVar126._0_4_ = fVar156 * auVar125._0_4_;
      fVar161 = auVar135._4_4_;
      auVar126._4_4_ = fVar161 * auVar125._4_4_;
      fVar162 = auVar135._8_4_;
      auVar126._8_4_ = fVar162 * auVar125._8_4_;
      fVar163 = auVar135._12_4_;
      auVar126._12_4_ = fVar163 * auVar125._12_4_;
      auVar50 = vfmsub231ps_fma(auVar126,auVar147,auVar112);
      auVar113._0_4_ = fVar12 * auVar50._0_4_;
      auVar113._4_4_ = fVar13 * auVar50._4_4_;
      auVar113._8_4_ = fVar14 * auVar50._8_4_;
      auVar113._12_4_ = fVar15 * auVar50._12_4_;
      auVar130 = vfmadd231ps_fma(auVar113,auVar86,auVar130);
      auVar152 = vfmadd231ps_fma(auVar130,auVar121,auVar152);
      auVar130 = vsubps_avx(auVar109,auVar157);
      auVar50._0_4_ = auVar157._0_4_ + auVar109._0_4_;
      auVar50._4_4_ = auVar157._4_4_ + auVar109._4_4_;
      auVar50._8_4_ = auVar157._8_4_ + auVar109._8_4_;
      auVar50._12_4_ = auVar157._12_4_ + auVar109._12_4_;
      auVar157 = vsubps_avx(auVar95,auVar142);
      auVar69._0_4_ = auVar95._0_4_ + auVar142._0_4_;
      auVar69._4_4_ = auVar95._4_4_ + auVar142._4_4_;
      auVar69._8_4_ = auVar95._8_4_ + auVar142._8_4_;
      auVar69._12_4_ = auVar95._12_4_ + auVar142._12_4_;
      auVar142 = vsubps_avx(auVar85,auVar150);
      auVar80._0_4_ = auVar85._0_4_ + auVar150._0_4_;
      auVar80._4_4_ = auVar85._4_4_ + auVar150._4_4_;
      auVar80._8_4_ = auVar85._8_4_ + auVar150._8_4_;
      auVar80._12_4_ = auVar85._12_4_ + auVar150._12_4_;
      auVar100._0_4_ = auVar142._0_4_ * auVar69._0_4_;
      auVar100._4_4_ = auVar142._4_4_ * auVar69._4_4_;
      auVar100._8_4_ = auVar142._8_4_ * auVar69._8_4_;
      auVar100._12_4_ = auVar142._12_4_ * auVar69._12_4_;
      auVar95 = vfmsub231ps_fma(auVar100,auVar157,auVar80);
      auVar81._0_4_ = auVar130._0_4_ * auVar80._0_4_;
      auVar81._4_4_ = auVar130._4_4_ * auVar80._4_4_;
      auVar81._8_4_ = auVar130._8_4_ * auVar80._8_4_;
      auVar81._12_4_ = auVar130._12_4_ * auVar80._12_4_;
      auVar109 = vfmsub231ps_fma(auVar81,auVar142,auVar50);
      auVar85._0_4_ = auVar50._0_4_ * auVar157._0_4_;
      auVar85._4_4_ = auVar50._4_4_ * auVar157._4_4_;
      auVar85._8_4_ = auVar50._8_4_ * auVar157._8_4_;
      auVar85._12_4_ = auVar50._12_4_ * auVar157._12_4_;
      auVar85 = vfmsub231ps_fma(auVar85,auVar130,auVar69);
      auVar51._0_4_ = fVar12 * auVar85._0_4_;
      auVar51._4_4_ = fVar13 * auVar85._4_4_;
      auVar51._8_4_ = fVar14 * auVar85._8_4_;
      auVar51._12_4_ = fVar15 * auVar85._12_4_;
      auVar109 = vfmadd231ps_fma(auVar51,auVar86,auVar109);
      auVar150 = vfmadd231ps_fma(auVar109,auVar121,auVar95);
      auVar127._0_4_ = auVar150._0_4_ + auVar145._0_4_ + auVar152._0_4_;
      auVar127._4_4_ = auVar150._4_4_ + auVar145._4_4_ + auVar152._4_4_;
      auVar127._8_4_ = auVar150._8_4_ + auVar145._8_4_ + auVar152._8_4_;
      auVar127._12_4_ = auVar150._12_4_ + auVar145._12_4_ + auVar152._12_4_;
      auVar109 = vminps_avx(auVar145,auVar152);
      auVar95 = vminps_avx(auVar109,auVar150);
      auVar109 = vandps_avx(auVar127,local_36a8);
      auVar82._0_4_ = auVar109._0_4_ * 1.1920929e-07;
      auVar82._4_4_ = auVar109._4_4_ * 1.1920929e-07;
      auVar82._8_4_ = auVar109._8_4_ * 1.1920929e-07;
      auVar82._12_4_ = auVar109._12_4_ * 1.1920929e-07;
      uVar41 = CONCAT44(auVar82._4_4_,auVar82._0_4_);
      auVar101._0_8_ = uVar41 ^ 0x8000000080000000;
      auVar101._8_4_ = -auVar82._8_4_;
      auVar101._12_4_ = -auVar82._12_4_;
      auVar95 = vcmpps_avx(auVar95,auVar101,5);
      auVar85 = vmaxps_avx(auVar145,auVar152);
      auVar85 = vmaxps_avx(auVar85,auVar150);
      auVar85 = vcmpps_avx(auVar85,auVar82,2);
      auVar95 = vorps_avx(auVar95,auVar85);
      auVar85 = auVar98 & auVar95;
      if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar85[0xf])
      {
        auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar52._0_4_ = fVar156 * auVar79._0_4_;
        auVar52._4_4_ = fVar161 * auVar79._4_4_;
        auVar52._8_4_ = fVar162 * auVar79._8_4_;
        auVar52._12_4_ = fVar163 * auVar79._12_4_;
        auVar70._0_4_ = fVar164 * auVar49._0_4_;
        auVar70._4_4_ = fVar169 * auVar49._4_4_;
        auVar70._8_4_ = fVar170 * auVar49._8_4_;
        auVar70._12_4_ = fVar171 * auVar49._12_4_;
        auVar150 = vfmsub213ps_fma(auVar49,auVar141,auVar52);
        auVar83._0_4_ = fVar172 * auVar157._0_4_;
        auVar83._4_4_ = fVar173 * auVar157._4_4_;
        auVar83._8_4_ = fVar174 * auVar157._8_4_;
        auVar83._12_4_ = fVar175 * auVar157._12_4_;
        auVar102._0_4_ = fVar164 * auVar142._0_4_;
        auVar102._4_4_ = fVar169 * auVar142._4_4_;
        auVar102._8_4_ = fVar170 * auVar142._8_4_;
        auVar102._12_4_ = fVar171 * auVar142._12_4_;
        auVar49 = vfmsub213ps_fma(auVar142,auVar135,auVar83);
        auVar85 = vandps_avx(auVar52,local_36a8);
        auVar142 = vandps_avx(auVar83,local_36a8);
        auVar85 = vcmpps_avx(auVar85,auVar142,1);
        local_3738.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar49,auVar150,auVar85);
        auVar53._0_4_ = auVar130._0_4_ * fVar156;
        auVar53._4_4_ = auVar130._4_4_ * fVar161;
        auVar53._8_4_ = auVar130._8_4_ * fVar162;
        auVar53._12_4_ = auVar130._12_4_ * fVar163;
        auVar142 = vfmsub213ps_fma(auVar130,auVar141,auVar102);
        auVar84._0_4_ = fVar172 * auVar158._0_4_;
        auVar84._4_4_ = fVar173 * auVar158._4_4_;
        auVar84._8_4_ = fVar174 * auVar158._8_4_;
        auVar84._12_4_ = fVar175 * auVar158._12_4_;
        auVar150 = vfmsub213ps_fma(auVar79,auVar147,auVar84);
        auVar85 = vandps_avx(auVar84,local_36a8);
        auVar141 = vandps_avx(auVar102,local_36a8);
        auVar85 = vcmpps_avx(auVar85,auVar141,1);
        local_3738.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar142,auVar150,auVar85);
        auVar142 = vfmsub213ps_fma(auVar158,auVar135,auVar70);
        auVar150 = vfmsub213ps_fma(auVar157,auVar147,auVar53);
        auVar85 = vandps_avx(local_36a8,auVar70);
        auVar141 = vandps_avx(local_36a8,auVar53);
        auVar85 = vcmpps_avx(auVar85,auVar141,1);
        local_3738.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar150,auVar142,auVar85);
        local_38d8 = auVar23._0_4_;
        fStack_38d4 = auVar23._4_4_;
        fStack_38d0 = auVar23._8_4_;
        auVar54._0_4_ = local_3738._32_4_ * local_38d8;
        auVar54._4_4_ = local_3738._36_4_ * fStack_38d4;
        auVar54._8_4_ = local_3738._40_4_ * fStack_38d0;
        auVar54._12_4_ = local_3738._44_4_ * fVar15;
        auVar85 = vfmadd213ps_fma(auVar86,(undefined1  [16])local_3738.field_0.y.field_0,auVar54);
        auVar85 = vfmadd213ps_fma(auVar121,(undefined1  [16])local_3738.field_0.x.field_0,auVar85);
        auVar55._0_4_ = auVar85._0_4_ + auVar85._0_4_;
        auVar55._4_4_ = auVar85._4_4_ + auVar85._4_4_;
        auVar55._8_4_ = auVar85._8_4_ + auVar85._8_4_;
        auVar55._12_4_ = auVar85._12_4_ + auVar85._12_4_;
        auVar71._0_4_ = local_3738._32_4_ * fVar6;
        auVar71._4_4_ = local_3738._36_4_ * fVar7;
        auVar71._8_4_ = local_3738._40_4_ * fVar8;
        auVar71._12_4_ = local_3738._44_4_ * fVar9;
        auVar85 = vfmadd213ps_fma(auVar123,(undefined1  [16])local_3738.field_0.y.field_0,auVar71);
        auVar86 = vfmadd213ps_fma(auVar122,(undefined1  [16])local_3738.field_0.x.field_0,auVar85);
        auVar85 = vrcpps_avx(auVar55);
        auVar136._8_4_ = 0x3f800000;
        auVar136._0_8_ = 0x3f8000003f800000;
        auVar136._12_4_ = 0x3f800000;
        auVar121 = vfnmadd213ps_fma(auVar85,auVar55,auVar136);
        auVar85 = vfmadd132ps_fma(auVar121,auVar85,auVar85);
        local_3708._0_4_ = (auVar86._0_4_ + auVar86._0_4_) * auVar85._0_4_;
        local_3708._4_4_ = (auVar86._4_4_ + auVar86._4_4_) * auVar85._4_4_;
        local_3708._8_4_ = (auVar86._8_4_ + auVar86._8_4_) * auVar85._8_4_;
        local_3708._12_4_ = (auVar86._12_4_ + auVar86._12_4_) * auVar85._12_4_;
        auVar85 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),local_3708,2);
        auVar86 = vcmpps_avx(local_3708,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar85 = vandps_avx(auVar85,auVar86);
        uVar41 = CONCAT44(auVar55._4_4_,auVar55._0_4_);
        auVar103._0_8_ = uVar41 ^ 0x8000000080000000;
        auVar103._8_4_ = -auVar55._8_4_;
        auVar103._12_4_ = -auVar55._12_4_;
        auVar86 = vcmpps_avx(auVar55,auVar103,4);
        auVar85 = vandps_avx(auVar86,auVar85);
        auVar95 = vandps_avx(auVar95,auVar98);
        auVar85 = vpslld_avx(auVar85,0x1f);
        auVar86 = vpsrad_avx(auVar85,0x1f);
        auVar85 = auVar95 & auVar86;
        if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar85[0xf]
           ) {
          auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar95 = vandps_avx(auVar86,auVar95);
          pGVar4 = (context->scene->geometries).items[uVar29].ptr;
          uVar2 = pGVar4->mask;
          auVar87._4_4_ = uVar2;
          auVar87._0_4_ = uVar2;
          auVar87._8_4_ = uVar2;
          auVar87._12_4_ = uVar2;
          auVar85 = vpand_avx(auVar87,*(undefined1 (*) [16])(ray + 0x90));
          auVar85 = vpcmpeqd_avx(auVar85,_DAT_01f45a50);
          auVar86 = auVar95 & ~auVar85;
          auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar86[0xf] < '\0') {
            uVar1 = *(undefined4 *)((long)&local_3698 + lVar40 * 4);
            auVar95 = vandnps_avx(auVar85,auVar95);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar85 = vrcpps_avx(auVar127);
              auVar140._8_4_ = 0x3f800000;
              auVar140._0_8_ = 0x3f8000003f800000;
              auVar140._12_4_ = 0x3f800000;
              auVar86 = vfnmadd213ps_fma(auVar127,auVar85,auVar140);
              auVar85 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
              auVar62._8_4_ = 0x219392ef;
              auVar62._0_8_ = 0x219392ef219392ef;
              auVar62._12_4_ = 0x219392ef;
              auVar109 = vcmpps_avx(auVar109,auVar62,5);
              auVar109 = vandps_avx(auVar109,auVar85);
              auVar93._0_4_ = auVar109._0_4_ * auVar145._0_4_;
              auVar93._4_4_ = auVar109._4_4_ * auVar145._4_4_;
              auVar93._8_4_ = auVar109._8_4_ * auVar145._8_4_;
              auVar93._12_4_ = auVar109._12_4_ * auVar145._12_4_;
              auVar85 = vminps_avx(auVar93,auVar140);
              auVar63._0_4_ = auVar152._0_4_ * auVar109._0_4_;
              auVar63._4_4_ = auVar152._4_4_ * auVar109._4_4_;
              auVar63._8_4_ = auVar152._8_4_ * auVar109._8_4_;
              auVar63._12_4_ = auVar152._12_4_ * auVar109._12_4_;
              auVar109 = vminps_avx(auVar63,auVar140);
              auVar86 = vsubps_avx(auVar140,auVar85);
              auVar121 = vsubps_avx(auVar140,auVar109);
              auVar21._8_8_ = uVar25;
              auVar21._0_8_ = uVar24;
              local_36e8 = vblendvps_avx(auVar85,auVar86,auVar21);
              local_36f8 = vblendvps_avx(auVar109,auVar121,auVar21);
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&local_3738.field_0);
              local_36d8._4_4_ = uVar29;
              local_36d8._0_4_ = uVar29;
              local_36d8._8_4_ = uVar29;
              local_36d8._12_4_ = uVar29;
              local_36e8._4_4_ = uVar1;
              local_36e8._0_4_ = uVar1;
              local_36e8._8_4_ = uVar1;
              local_36e8._12_4_ = uVar1;
              vpcmpeqd_avx2(ZEXT1632(local_36d8),ZEXT1632(local_36d8));
              uStack_36c4 = context->user->instID[0];
              local_36c8 = uStack_36c4;
              uStack_36c0 = uStack_36c4;
              uStack_36bc = uStack_36c4;
              uStack_36b8 = context->user->instPrimID[0];
              uStack_36b4 = uStack_36b8;
              uStack_36b0 = uStack_36b8;
              uStack_36ac = uStack_36b8;
              auVar109 = *(undefined1 (*) [16])(ray + 0x80);
              auVar85 = vblendvps_avx(auVar109,(undefined1  [16])t.field_0,auVar95);
              *(undefined1 (*) [16])(ray + 0x80) = auVar85;
              args.valid = (int *)local_3878;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&local_3738;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              local_3878 = auVar95;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->occlusionFilterN)(&args);
              }
              if (local_3878 == (undefined1  [16])0x0) {
                auVar95 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar95 = auVar95 ^ _DAT_01f46b70;
                auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              }
              else {
                p_Var5 = context->args->filter;
                if (p_Var5 == (RTCFilterFunctionN)0x0) {
                  auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                }
                else {
                  auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar4->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var5)(&args);
                    auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                 ));
                    auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                 ));
                    auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                  }
                }
                auVar85 = vpcmpeqd_avx(local_3878,_DAT_01f45a50);
                auVar95 = auVar85 ^ _DAT_01f46b70;
                auVar94._8_4_ = 0xff800000;
                auVar94._0_8_ = 0xff800000ff800000;
                auVar94._12_4_ = 0xff800000;
                auVar85 = vblendvps_avx(auVar94,*(undefined1 (*) [16])(args.ray + 0x80),auVar85);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar85;
              }
              auVar85 = vpslld_avx(auVar95,0x1f);
              auVar95 = vpsrad_avx(auVar85,0x1f);
              auVar109 = vblendvps_avx(auVar109,*(undefined1 (*) [16])local_3860,auVar85);
              *(undefined1 (*) [16])local_3860 = auVar109;
            }
            auVar98 = vpandn_avx(auVar95,auVar98);
          }
        }
      }
      if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar98 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar98 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar98[0xf])
      break;
      auVar109 = *(undefined1 (*) [16])ray;
      auVar95 = *(undefined1 (*) [16])(ray + 0x10);
      auVar85 = *(undefined1 (*) [16])(ray + 0x20);
      auVar122 = vsubps_avx(local_3818,auVar109);
      auVar123 = vsubps_avx(local_3828,auVar95);
      auVar22._4_4_ = uVar30;
      auVar22._0_4_ = uVar30;
      auVar22._8_4_ = uVar30;
      auVar22._12_4_ = uVar30;
      auVar86 = vsubps_avx(auVar22,auVar85);
      auVar121 = vsubps_avx(auVar166,auVar109);
      auVar141 = vsubps_avx(auVar144,auVar95);
      auVar142 = vsubps_avx(auVar151,auVar85);
      auVar150 = vsubps_avx(auVar120,auVar109);
      auVar49 = vsubps_avx(auVar124,auVar95);
      auVar85 = vsubps_avx(_local_3888,auVar85);
      auVar79 = vsubps_avx(auVar150,auVar122);
      auVar157 = vsubps_avx(auVar49,auVar123);
      auVar158 = vsubps_avx(auVar85,auVar86);
      auVar72._0_4_ = auVar122._0_4_ + auVar150._0_4_;
      auVar72._4_4_ = auVar122._4_4_ + auVar150._4_4_;
      auVar72._8_4_ = auVar122._8_4_ + auVar150._8_4_;
      auVar72._12_4_ = auVar122._12_4_ + auVar150._12_4_;
      auVar137._0_4_ = auVar49._0_4_ + auVar123._0_4_;
      auVar137._4_4_ = auVar49._4_4_ + auVar123._4_4_;
      auVar137._8_4_ = auVar49._8_4_ + auVar123._8_4_;
      auVar137._12_4_ = auVar49._12_4_ + auVar123._12_4_;
      fVar6 = auVar86._0_4_;
      auVar148._0_4_ = auVar85._0_4_ + fVar6;
      fVar7 = auVar86._4_4_;
      auVar148._4_4_ = auVar85._4_4_ + fVar7;
      fVar8 = auVar86._8_4_;
      auVar148._8_4_ = auVar85._8_4_ + fVar8;
      fVar9 = auVar86._12_4_;
      auVar148._12_4_ = auVar85._12_4_ + fVar9;
      auVar159._0_4_ = auVar137._0_4_ * auVar158._0_4_;
      auVar159._4_4_ = auVar137._4_4_ * auVar158._4_4_;
      auVar159._8_4_ = auVar137._8_4_ * auVar158._8_4_;
      auVar159._12_4_ = auVar137._12_4_ * auVar158._12_4_;
      auVar147 = vfmsub231ps_fma(auVar159,auVar157,auVar148);
      auVar154._0_4_ = auVar148._0_4_ * auVar79._0_4_;
      auVar154._4_4_ = auVar148._4_4_ * auVar79._4_4_;
      auVar154._8_4_ = auVar148._8_4_ * auVar79._8_4_;
      auVar154._12_4_ = auVar148._12_4_ * auVar79._12_4_;
      auVar95 = vfmsub231ps_fma(auVar154,auVar158,auVar72);
      auVar73._0_4_ = auVar157._0_4_ * auVar72._0_4_;
      auVar73._4_4_ = auVar157._4_4_ * auVar72._4_4_;
      auVar73._8_4_ = auVar157._8_4_ * auVar72._8_4_;
      auVar73._12_4_ = auVar157._12_4_ * auVar72._12_4_;
      auVar109 = vfmsub231ps_fma(auVar73,auVar79,auVar137);
      fVar164 = *(float *)(ray + 0x60);
      fVar169 = *(float *)(ray + 100);
      fVar170 = *(float *)(ray + 0x68);
      auVar23 = *(undefined1 (*) [12])(ray + 0x60);
      fVar171 = *(float *)(ray + 0x6c);
      auVar146._0_4_ = fVar164 * auVar109._0_4_;
      auVar146._4_4_ = fVar169 * auVar109._4_4_;
      auVar146._8_4_ = fVar170 * auVar109._8_4_;
      auVar146._12_4_ = fVar171 * auVar109._12_4_;
      auVar109 = *(undefined1 (*) [16])(ray + 0x50);
      auVar135 = vfmadd231ps_fma(auVar146,auVar109,auVar95);
      auVar95 = *(undefined1 (*) [16])(ray + 0x40);
      auVar152 = vfmadd231ps_fma(auVar135,auVar95,auVar147);
      auVar135 = vsubps_avx(auVar123,auVar141);
      auVar147 = vsubps_avx(auVar86,auVar142);
      auVar74._0_4_ = auVar141._0_4_ + auVar123._0_4_;
      auVar74._4_4_ = auVar141._4_4_ + auVar123._4_4_;
      auVar74._8_4_ = auVar141._8_4_ + auVar123._8_4_;
      auVar74._12_4_ = auVar141._12_4_ + auVar123._12_4_;
      auVar138._0_4_ = fVar6 + auVar142._0_4_;
      auVar138._4_4_ = fVar7 + auVar142._4_4_;
      auVar138._8_4_ = fVar8 + auVar142._8_4_;
      auVar138._12_4_ = fVar9 + auVar142._12_4_;
      fVar172 = auVar147._0_4_;
      auVar104._0_4_ = fVar172 * auVar74._0_4_;
      fVar173 = auVar147._4_4_;
      auVar104._4_4_ = fVar173 * auVar74._4_4_;
      fVar174 = auVar147._8_4_;
      auVar104._8_4_ = fVar174 * auVar74._8_4_;
      fVar175 = auVar147._12_4_;
      auVar104._12_4_ = fVar175 * auVar74._12_4_;
      auVar145 = vfmsub231ps_fma(auVar104,auVar135,auVar138);
      auVar130 = vsubps_avx(auVar122,auVar121);
      fVar12 = auVar130._0_4_;
      auVar139._0_4_ = auVar138._0_4_ * fVar12;
      fVar14 = auVar130._4_4_;
      auVar139._4_4_ = auVar138._4_4_ * fVar14;
      fVar156 = auVar130._8_4_;
      auVar139._8_4_ = auVar138._8_4_ * fVar156;
      fVar162 = auVar130._12_4_;
      auVar139._12_4_ = auVar138._12_4_ * fVar162;
      auVar132._0_4_ = auVar122._0_4_ + auVar121._0_4_;
      auVar132._4_4_ = auVar122._4_4_ + auVar121._4_4_;
      auVar132._8_4_ = auVar122._8_4_ + auVar121._8_4_;
      auVar132._12_4_ = auVar122._12_4_ + auVar121._12_4_;
      auVar86 = vfmsub231ps_fma(auVar139,auVar147,auVar132);
      fVar13 = auVar135._0_4_;
      auVar133._0_4_ = auVar132._0_4_ * fVar13;
      fVar15 = auVar135._4_4_;
      auVar133._4_4_ = auVar132._4_4_ * fVar15;
      fVar161 = auVar135._8_4_;
      auVar133._8_4_ = auVar132._8_4_ * fVar161;
      fVar163 = auVar135._12_4_;
      auVar133._12_4_ = auVar132._12_4_ * fVar163;
      auVar50 = vfmsub231ps_fma(auVar133,auVar130,auVar74);
      auVar75._0_4_ = fVar164 * auVar50._0_4_;
      auVar75._4_4_ = fVar169 * auVar50._4_4_;
      auVar75._8_4_ = fVar170 * auVar50._8_4_;
      auVar75._12_4_ = fVar171 * auVar50._12_4_;
      auVar86 = vfmadd231ps_fma(auVar75,auVar109,auVar86);
      auVar50 = vfmadd231ps_fma(auVar86,auVar95,auVar145);
      auVar145 = vsubps_avx(auVar121,auVar150);
      auVar88._0_4_ = auVar121._0_4_ + auVar150._0_4_;
      auVar88._4_4_ = auVar121._4_4_ + auVar150._4_4_;
      auVar88._8_4_ = auVar121._8_4_ + auVar150._8_4_;
      auVar88._12_4_ = auVar121._12_4_ + auVar150._12_4_;
      auVar150 = vsubps_avx(auVar141,auVar49);
      auVar105._0_4_ = auVar141._0_4_ + auVar49._0_4_;
      auVar105._4_4_ = auVar141._4_4_ + auVar49._4_4_;
      auVar105._8_4_ = auVar141._8_4_ + auVar49._8_4_;
      auVar105._12_4_ = auVar141._12_4_ + auVar49._12_4_;
      auVar141 = vsubps_avx(auVar142,auVar85);
      auVar56._0_4_ = auVar142._0_4_ + auVar85._0_4_;
      auVar56._4_4_ = auVar142._4_4_ + auVar85._4_4_;
      auVar56._8_4_ = auVar142._8_4_ + auVar85._8_4_;
      auVar56._12_4_ = auVar142._12_4_ + auVar85._12_4_;
      auVar114._0_4_ = auVar141._0_4_ * auVar105._0_4_;
      auVar114._4_4_ = auVar141._4_4_ * auVar105._4_4_;
      auVar114._8_4_ = auVar141._8_4_ * auVar105._8_4_;
      auVar114._12_4_ = auVar141._12_4_ * auVar105._12_4_;
      auVar86 = vfmsub231ps_fma(auVar114,auVar150,auVar56);
      auVar57._0_4_ = auVar145._0_4_ * auVar56._0_4_;
      auVar57._4_4_ = auVar145._4_4_ * auVar56._4_4_;
      auVar57._8_4_ = auVar145._8_4_ * auVar56._8_4_;
      auVar57._12_4_ = auVar145._12_4_ * auVar56._12_4_;
      auVar85 = vfmsub231ps_fma(auVar57,auVar141,auVar88);
      auVar89._0_4_ = auVar88._0_4_ * auVar150._0_4_;
      auVar89._4_4_ = auVar88._4_4_ * auVar150._4_4_;
      auVar89._8_4_ = auVar88._8_4_ * auVar150._8_4_;
      auVar89._12_4_ = auVar88._12_4_ * auVar150._12_4_;
      auVar121 = vfmsub231ps_fma(auVar89,auVar145,auVar105);
      auVar90._0_4_ = fVar164 * auVar121._0_4_;
      auVar90._4_4_ = fVar169 * auVar121._4_4_;
      auVar90._8_4_ = fVar170 * auVar121._8_4_;
      auVar90._12_4_ = fVar171 * auVar121._12_4_;
      auVar85 = vfmadd231ps_fma(auVar90,auVar109,auVar85);
      auVar142 = vfmadd231ps_fma(auVar85,auVar95,auVar86);
      auVar134._0_4_ = auVar142._0_4_ + auVar152._0_4_ + auVar50._0_4_;
      auVar134._4_4_ = auVar142._4_4_ + auVar152._4_4_ + auVar50._4_4_;
      auVar134._8_4_ = auVar142._8_4_ + auVar152._8_4_ + auVar50._8_4_;
      auVar134._12_4_ = auVar142._12_4_ + auVar152._12_4_ + auVar50._12_4_;
      auVar85 = vminps_avx(auVar152,auVar50);
      auVar86 = vminps_avx(auVar85,auVar142);
      auVar85 = vandps_avx(auVar134,local_36a8);
      auVar106._0_4_ = auVar85._0_4_ * 1.1920929e-07;
      auVar106._4_4_ = auVar85._4_4_ * 1.1920929e-07;
      auVar106._8_4_ = auVar85._8_4_ * 1.1920929e-07;
      auVar106._12_4_ = auVar85._12_4_ * 1.1920929e-07;
      uVar41 = CONCAT44(auVar106._4_4_,auVar106._0_4_);
      auVar115._0_8_ = uVar41 ^ 0x8000000080000000;
      auVar115._8_4_ = -auVar106._8_4_;
      auVar115._12_4_ = -auVar106._12_4_;
      auVar86 = vcmpps_avx(auVar86,auVar115,5);
      auVar121 = vmaxps_avx(auVar152,auVar50);
      auVar121 = vmaxps_avx(auVar121,auVar142);
      auVar121 = vcmpps_avx(auVar121,auVar106,2);
      auVar86 = vorps_avx(auVar86,auVar121);
      auVar121 = auVar98 & auVar86;
      if ((((auVar121 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar121 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar121 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar121[0xf]
         ) {
        auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        auVar77 = ZEXT1664(auVar98);
      }
      else {
        auVar58._0_4_ = fVar13 * auVar158._0_4_;
        auVar58._4_4_ = fVar15 * auVar158._4_4_;
        auVar58._8_4_ = fVar161 * auVar158._8_4_;
        auVar58._12_4_ = fVar163 * auVar158._12_4_;
        auVar91._0_4_ = fVar12 * auVar157._0_4_;
        auVar91._4_4_ = fVar14 * auVar157._4_4_;
        auVar91._8_4_ = fVar156 * auVar157._8_4_;
        auVar91._12_4_ = fVar162 * auVar157._12_4_;
        auVar142 = vfmsub213ps_fma(auVar157,auVar147,auVar58);
        auVar107._0_4_ = fVar172 * auVar150._0_4_;
        auVar107._4_4_ = fVar173 * auVar150._4_4_;
        auVar107._8_4_ = fVar174 * auVar150._8_4_;
        auVar107._12_4_ = fVar175 * auVar150._12_4_;
        auVar116._0_4_ = fVar12 * auVar141._0_4_;
        auVar116._4_4_ = fVar14 * auVar141._4_4_;
        auVar116._8_4_ = fVar156 * auVar141._8_4_;
        auVar116._12_4_ = fVar162 * auVar141._12_4_;
        auVar49 = vfmsub213ps_fma(auVar141,auVar135,auVar107);
        auVar121 = vandps_avx(auVar58,local_36a8);
        auVar141 = vandps_avx(auVar107,local_36a8);
        auVar121 = vcmpps_avx(auVar121,auVar141,1);
        local_3738.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar49,auVar142,auVar121);
        auVar59._0_4_ = auVar145._0_4_ * fVar13;
        auVar59._4_4_ = auVar145._4_4_ * fVar15;
        auVar59._8_4_ = auVar145._8_4_ * fVar161;
        auVar59._12_4_ = auVar145._12_4_ * fVar163;
        auVar142 = vfmsub213ps_fma(auVar145,auVar147,auVar116);
        auVar108._0_4_ = auVar79._0_4_ * fVar172;
        auVar108._4_4_ = auVar79._4_4_ * fVar173;
        auVar108._8_4_ = auVar79._8_4_ * fVar174;
        auVar108._12_4_ = auVar79._12_4_ * fVar175;
        auVar49 = vfmsub213ps_fma(auVar158,auVar130,auVar108);
        auVar121 = vandps_avx(auVar108,local_36a8);
        auVar141 = vandps_avx(auVar116,local_36a8);
        auVar121 = vcmpps_avx(auVar121,auVar141,1);
        local_3738.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar142,auVar49,auVar121);
        auVar142 = vfmsub213ps_fma(auVar79,auVar135,auVar91);
        auVar150 = vfmsub213ps_fma(auVar150,auVar130,auVar59);
        auVar121 = vandps_avx(auVar91,local_36a8);
        auVar141 = vandps_avx(auVar59,local_36a8);
        auVar121 = vcmpps_avx(auVar121,auVar141,1);
        local_3738.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar150,auVar142,auVar121);
        local_3888._0_4_ = auVar23._0_4_;
        local_3888._4_4_ = auVar23._4_4_;
        fStack_3880 = auVar23._8_4_;
        auVar60._0_4_ = local_3738._32_4_ * (float)local_3888._0_4_;
        auVar60._4_4_ = local_3738._36_4_ * (float)local_3888._4_4_;
        auVar60._8_4_ = local_3738._40_4_ * fStack_3880;
        auVar60._12_4_ = local_3738._44_4_ * fVar171;
        auVar109 = vfmadd213ps_fma(auVar109,(undefined1  [16])local_3738.field_0.y.field_0,auVar60);
        auVar109 = vfmadd213ps_fma(auVar95,(undefined1  [16])local_3738.field_0.x.field_0,auVar109);
        auVar61._0_4_ = auVar109._0_4_ + auVar109._0_4_;
        auVar61._4_4_ = auVar109._4_4_ + auVar109._4_4_;
        auVar61._8_4_ = auVar109._8_4_ + auVar109._8_4_;
        auVar61._12_4_ = auVar109._12_4_ + auVar109._12_4_;
        auVar92._0_4_ = local_3738._32_4_ * fVar6;
        auVar92._4_4_ = local_3738._36_4_ * fVar7;
        auVar92._8_4_ = local_3738._40_4_ * fVar8;
        auVar92._12_4_ = local_3738._44_4_ * fVar9;
        auVar109 = vfmadd213ps_fma(auVar123,(undefined1  [16])local_3738.field_0.y.field_0,auVar92);
        auVar95 = vfmadd213ps_fma(auVar122,(undefined1  [16])local_3738.field_0.x.field_0,auVar109);
        auVar109 = vrcpps_avx(auVar61);
        auVar128._8_4_ = 0x3f800000;
        auVar128._0_8_ = 0x3f8000003f800000;
        auVar128._12_4_ = 0x3f800000;
        auVar121 = vfnmadd213ps_fma(auVar109,auVar61,auVar128);
        auVar109 = vfmadd132ps_fma(auVar121,auVar109,auVar109);
        local_3708._0_4_ = (auVar95._0_4_ + auVar95._0_4_) * auVar109._0_4_;
        local_3708._4_4_ = (auVar95._4_4_ + auVar95._4_4_) * auVar109._4_4_;
        local_3708._8_4_ = (auVar95._8_4_ + auVar95._8_4_) * auVar109._8_4_;
        local_3708._12_4_ = (auVar95._12_4_ + auVar95._12_4_) * auVar109._12_4_;
        auVar109 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),local_3708,2);
        auVar95 = vcmpps_avx(local_3708,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar109 = vandps_avx(auVar109,auVar95);
        uVar41 = CONCAT44(auVar61._4_4_,auVar61._0_4_);
        auVar117._0_8_ = uVar41 ^ 0x8000000080000000;
        auVar117._8_4_ = -auVar61._8_4_;
        auVar117._12_4_ = -auVar61._12_4_;
        auVar95 = vcmpps_avx(auVar61,auVar117,4);
        auVar109 = vandps_avx(auVar95,auVar109);
        auVar95 = vandps_avx(auVar98,auVar86);
        auVar109 = vpslld_avx(auVar109,0x1f);
        auVar86 = vpsrad_avx(auVar109,0x1f);
        auVar109 = auVar95 & auVar86;
        auVar77 = ZEXT1664(auVar98);
        if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar109 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar109 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar109[0xf]) {
          auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar109 = vandps_avx(auVar86,auVar95);
          uVar2 = *(uint *)(lVar34 + lVar40 * 4);
          pGVar4 = (context->scene->geometries).items[uVar2].ptr;
          uVar29 = pGVar4->mask;
          auVar110._4_4_ = uVar29;
          auVar110._0_4_ = uVar29;
          auVar110._8_4_ = uVar29;
          auVar110._12_4_ = uVar29;
          auVar95 = vpand_avx(auVar110,*(undefined1 (*) [16])(ray + 0x90));
          auVar95 = vpcmpeqd_avx(auVar95,_DAT_01f45a50);
          auVar86 = auVar109 & ~auVar95;
          auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar86[0xf] < '\0') {
            uVar30 = *(undefined4 *)((long)&local_3698 + lVar40 * 4);
            auVar109 = vandnps_avx(auVar95,auVar109);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar95 = vrcpps_avx(auVar134);
              auVar118._8_4_ = 0x3f800000;
              auVar118._0_8_ = 0x3f8000003f800000;
              auVar118._12_4_ = 0x3f800000;
              auVar86 = vfnmadd213ps_fma(auVar134,auVar95,auVar118);
              auVar86 = vfmadd132ps_fma(auVar86,auVar95,auVar95);
              auVar64._8_4_ = 0x219392ef;
              auVar64._0_8_ = 0x219392ef219392ef;
              auVar64._12_4_ = 0x219392ef;
              auVar95 = vcmpps_avx(auVar85,auVar64,5);
              auVar95 = vandps_avx(auVar95,auVar86);
              auVar111._0_4_ = auVar95._0_4_ * auVar152._0_4_;
              auVar111._4_4_ = auVar95._4_4_ * auVar152._4_4_;
              auVar111._8_4_ = auVar95._8_4_ * auVar152._8_4_;
              auVar111._12_4_ = auVar95._12_4_ * auVar152._12_4_;
              auVar85 = vminps_avx(auVar111,auVar118);
              auVar65._0_4_ = auVar50._0_4_ * auVar95._0_4_;
              auVar65._4_4_ = auVar50._4_4_ * auVar95._4_4_;
              auVar65._8_4_ = auVar50._8_4_ * auVar95._8_4_;
              auVar65._12_4_ = auVar50._12_4_ * auVar95._12_4_;
              auVar95 = vminps_avx(auVar65,auVar118);
              auVar86 = vsubps_avx(auVar118,auVar85);
              auVar121 = vsubps_avx(auVar118,auVar95);
              auVar20._8_8_ = uVar27;
              auVar20._0_8_ = uVar26;
              local_36e8 = vblendvps_avx(auVar85,auVar86,auVar20);
              local_36f8 = vblendvps_avx(auVar95,auVar121,auVar20);
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&local_3738.field_0);
              local_36d8._4_4_ = uVar2;
              local_36d8._0_4_ = uVar2;
              local_36d8._8_4_ = uVar2;
              local_36d8._12_4_ = uVar2;
              local_36e8._4_4_ = uVar30;
              local_36e8._0_4_ = uVar30;
              local_36e8._8_4_ = uVar30;
              local_36e8._12_4_ = uVar30;
              vpcmpeqd_avx2(ZEXT1632(local_36d8),ZEXT1632(local_36d8));
              uStack_36c4 = context->user->instID[0];
              local_36c8 = uStack_36c4;
              uStack_36c0 = uStack_36c4;
              uStack_36bc = uStack_36c4;
              uStack_36b8 = context->user->instPrimID[0];
              uStack_36b4 = uStack_36b8;
              uStack_36b0 = uStack_36b8;
              uStack_36ac = uStack_36b8;
              auVar95 = *(undefined1 (*) [16])(ray + 0x80);
              auVar85 = vblendvps_avx(auVar95,(undefined1  [16])t.field_0,auVar109);
              *(undefined1 (*) [16])(ray + 0x80) = auVar85;
              args.valid = (int *)local_3878;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&local_3738;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              local_3878 = auVar109;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->occlusionFilterN)(&args);
              }
              if (local_3878 == (undefined1  [16])0x0) {
                auVar109 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar109 = auVar109 ^ _DAT_01f46b70;
                auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              }
              else {
                p_Var5 = context->args->filter;
                if (p_Var5 == (RTCFilterFunctionN)0x0) {
                  auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                }
                else {
                  auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar4->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var5)(&args);
                    auVar160 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                 ));
                    auVar149 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                 ));
                    auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                  }
                }
                auVar85 = vpcmpeqd_avx(local_3878,_DAT_01f45a50);
                auVar109 = auVar85 ^ _DAT_01f46b70;
                auVar96._8_4_ = 0xff800000;
                auVar96._0_8_ = 0xff800000ff800000;
                auVar96._12_4_ = 0xff800000;
                auVar85 = vblendvps_avx(auVar96,*(undefined1 (*) [16])(args.ray + 0x80),auVar85);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar85;
              }
              auVar85 = vpslld_avx(auVar109,0x1f);
              auVar109 = vpsrad_avx(auVar85,0x1f);
              auVar95 = vblendvps_avx(auVar95,*(undefined1 (*) [16])local_3860,auVar85);
              *(undefined1 (*) [16])local_3860 = auVar95;
            }
            auVar109 = vpandn_avx(auVar109,auVar98);
            auVar77 = ZEXT1664(auVar109);
          }
        }
      }
      lVar40 = lVar40 + 1;
      auVar98 = auVar77._0_16_;
    } while ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar77[0xf] < '\0');
    auVar77 = ZEXT1664(local_3838);
    auVar95 = vandps_avx(auVar98,local_3838);
    lVar33 = lVar33 + 1;
    lVar34 = lVar34 + 0xe0;
    auVar98 = local_3838 & auVar98;
    auVar109 = local_3838;
    local_3838 = auVar95;
  } while ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar98[0xf] < '\0');
  auVar109 = vpcmpeqd_avx(auVar109,auVar109);
  auVar66._0_4_ = local_3838._0_4_ ^ auVar109._0_4_;
  auVar66._4_4_ = local_3838._4_4_ ^ auVar109._4_4_;
  auVar66._8_4_ = local_3838._8_4_ ^ auVar109._8_4_;
  auVar66._12_4_ = local_3838._12_4_ ^ auVar109._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar66,(undefined1  [16])terminated.field_0);
  auVar109 = auVar109 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar109 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar109 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar109 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar109[0xf])
  goto LAB_0163edfb;
  auVar77 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar97._8_4_ = 0xff800000;
  auVar97._0_8_ = 0xff800000ff800000;
  auVar97._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar97,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0163d894;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }